

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
* toml::detail::parse_file<toml::type_config>
            (result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  vector<toml::error_info,_std::allocator<toml::error_info>_> *this;
  comment_type *this_00;
  element_type *peVar1;
  long lVar2;
  undefined1 uVar3;
  bool bVar4;
  table_format_info *ptVar5;
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  *p_Var6;
  error_type *peVar7;
  value_type *pvVar8;
  reference pvVar9;
  error_type *peVar10;
  table_type *ptVar11;
  value_type *ppbVar12;
  error_type *peVar13;
  basic_value<toml::type_config> *extraout_RDX;
  basic_value<toml::type_config> *pbVar14;
  basic_value<toml::type_config> *extraout_RDX_00;
  basic_value<toml::type_config> *v;
  ulong uVar15;
  type *__args;
  location *plVar16;
  location *plVar17;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> *prVar18;
  string *this_01;
  undefined4 uVar19;
  int iVar20;
  table_format_info fmt;
  table_format_info fmt_00;
  allocator<char> local_1369;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  com;
  optional<toml::detail::multiline_spacer<toml::type_config>_> sp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1318;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> inserted;
  ulong local_12a0;
  ulong local_1290;
  result<toml::detail::none_t,_toml::error_info> res_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1208;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  com_res;
  result<toml::detail::none_t,_toml::error_info> res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1058;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1038;
  value_type com_opt;
  type reg;
  string local_f28;
  string local_f08;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_ee8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_eb0;
  string local_e78;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e58;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e20;
  string local_de8;
  string local_dc8;
  string local_da8;
  string local_d88;
  string local_d68;
  vector<toml::error_info,_std::allocator<toml::error_info>_> local_d48;
  value_type root;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c68;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c30;
  location local_bf8;
  location local_bb0;
  location local_b68;
  location local_b20;
  location first;
  error_info local_a90;
  region local_a38;
  region local_9d0;
  error_info local_968;
  error_info local_910;
  error_info local_8b8;
  error_info local_860;
  error_info local_808;
  error_info local_7b0;
  error_info local_758;
  error_info local_700;
  error_info local_6a8;
  error_info local_650;
  error_info local_5f8;
  error_info local_5a0;
  error_info local_548;
  basic_value<toml::type_config> local_4f0;
  basic_value<toml::type_config> local_428;
  region local_360;
  region local_2f8;
  region local_290;
  region local_228;
  basic_value<toml::type_config> local_1c0;
  basic_value<toml::type_config> local_f8;
  
  location::location(&first,loc);
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (loc->location_ <
      (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start)) {
    local_c68._M_buckets = &local_c68._M_single_bucket;
    local_c68._M_bucket_count = 1;
    local_c68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_c68._M_element_count = 0;
    local_c68._M_rehash_policy._M_max_load_factor = 1.0;
    local_c68._M_rehash_policy._4_4_ = 0;
    local_c68._M_rehash_policy._M_next_resize = 0;
    local_c68._M_single_bucket = (__node_base_ptr)0x0;
    local_1228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    region::region(&local_a38,loc);
    basic_value<toml::type_config>::basic_value
              (&root,(table_type *)&local_c68,(table_format_info)ZEXT816(0),&local_1228,&local_a38);
    region::~region(&local_a38);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1228);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_c68);
    ptVar5 = basic_value<toml::type_config>::as_table_fmt(&root);
    ptVar5->fmt = multiline;
    ptVar5 = basic_value<toml::type_config>::as_table_fmt(&root);
    ptVar5->indent_type = none;
    this = &ctx->errors_;
    do {
      peVar1 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if ((ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start) <= loc->location_) break;
      parse_comment_line<toml::type_config>(&com_res,loc,ctx);
      if (com_res.is_ok_ == true) {
        p_Var6 = &result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                  ::unwrap(&com_res,(source_location)0x4dacf8)->
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ;
        std::
        _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ::_Optional_base(&com_opt.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ,p_Var6);
        bVar4 = com_opt.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged;
        if (com_opt.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          iVar20 = 0;
          __args = (type *)&com_opt;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &root.comments_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
        }
        else {
          syntax::ws((repeat_at_least *)&res_1,&ctx->toml_spec_);
          syntax::newline((either *)&inserted,&ctx->toml_spec_);
          __args = &reg;
          sequence::sequence<toml::detail::repeat_at_least,toml::detail::either>
                    ((sequence *)__args,(repeat_at_least *)&res_1,(either *)&inserted);
          sequence::scan((region *)&res,(sequence *)__args,loc);
          lVar2 = CONCAT71(res._1_7_,res.is_ok_);
          region::~region((region *)&res);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)&reg.source_.
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)&inserted.field_1.succ_);
          if (res_1.field_1.fail_.value.title_._M_string_length != 0) {
            (**(code **)(*(long *)res_1.field_1.fail_.value.title_._M_string_length + 8))();
          }
          iVar20 = 3;
          if (lVar2 == 0) {
            __args = (type *)&first;
            location::operator=(loc,(location *)__args);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&root.comments_);
            iVar20 = 3;
          }
        }
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&com_opt);
        if (bVar4 != false) goto LAB_0031e871;
      }
      else {
        peVar10 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                  ::unwrap_err(&com_res,(source_location)0x4dad10);
        error_info::error_info(&local_548,peVar10);
        std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
        emplace_back<toml::error_info>(this,&local_548);
        error_info::~error_info(&local_548);
        __args = (type *)ctx;
        skip_comment_block<toml::type_config>(loc,ctx);
LAB_0031e871:
        iVar20 = 0;
      }
      result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
      ::cleanup(&com_res,(EVP_PKEY_CTX *)__args);
    } while (iVar20 == 0);
    plVar16 = loc;
    parse_table<toml::type_config>(&res,loc,ctx,&root);
    if (res.is_ok_ == false) {
      peVar7 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                         (&res,(source_location)0x4dad28);
      error_info::error_info(&local_a90,peVar7);
      std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
      emplace_back<toml::error_info>(this,&local_a90);
      error_info::~error_info(&local_a90);
      plVar16 = (location *)ctx;
      skip_until_next_table<toml::type_config>(loc,ctx);
    }
    result<toml::detail::none_t,_toml::error_info>::cleanup(&res,(EVP_PKEY_CTX *)plVar16);
    this_00 = &sp.
               super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
               ._M_payload.
               super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
               .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
               _M_payload._M_value.comments;
    pbVar14 = extraout_RDX;
    while (peVar1 = (loc->source_).
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,
          loc->location_ <
          (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start)) {
      skip_multiline_spacer<toml::type_config>(&sp,loc,ctx,true);
      plVar16 = loc;
      parse_array_table_key<toml::type_config>
                ((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                  *)&com_opt,loc,ctx);
      plVar17 = loc;
      if (com_opt.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._0_1_ == '\x01') {
        pvVar8 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                 ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                           *)&com_opt,(source_location)0x4dad40);
        local_1318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pvVar8->first).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pvVar8->first).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_1318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pvVar8->first).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pvVar8->first).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar8->first).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar8->first).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar8 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                 ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                           *)&com_opt,(source_location)0x4dad58);
        region::region(&reg,&pvVar8->second);
        com.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        com.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        com.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (sp.super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
            ._M_payload.
            super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
            .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
            _M_engaged == true) {
          uVar15 = 0;
          while( true ) {
            if ((sp.
                 super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                 .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
                 _M_engaged & 1U) == 0) {
              std::__throw_bad_optional_access();
            }
            if ((ulong)((long)sp.
                              super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                              .
                              super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                              ._M_payload._M_value.comments.comments.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        sp.
                        super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                        .
                        super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                        ._M_payload._8_8_ >> 5) <= uVar15) break;
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(&this_00->comments,uVar15);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&com,
                       pvVar9);
            uVar15 = uVar15 + 1;
          }
        }
        parse_comment_line<toml::type_config>(&com_res,loc,ctx);
        if (com_res.is_ok_ == true) {
          p_Var6 = &result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                    ::unwrap(&com_res,(source_location)0x4dad70)->
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ;
          std::
          _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            *)&inserted,p_Var6);
          if (inserted.field_1._24_1_ == '\x01') {
            prVar18 = &inserted;
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&com,(value_type *)prVar18);
          }
          else {
            prVar18 = (result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)ctx;
            skip_whitespace<toml::type_config>(loc,ctx);
            peVar1 = (loc->source_).
                     super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            if (loc->location_ <
                (ulong)((long)(peVar1->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(peVar1->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start)) {
              prVar18 = (result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)&res_1;
              syntax::newline((either *)prVar18,&ctx->toml_spec_);
              either::scan((region *)&res,(either *)prVar18,loc);
              lVar2 = CONCAT71(res._1_7_,res.is_ok_);
              region::~region((region *)&res);
              std::
              vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
              ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         *)&res_1.field_1.fail_);
              if (lVar2 == 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_de8,"toml::parse_file: newline (or EOF) expected",
                           (allocator<char> *)&res_1);
                syntax::newline((either *)&res,&ctx->toml_spec_);
                location::location(&local_b20,loc);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_d68,"",&local_1369);
                make_syntax_error<toml::detail::either>
                          (&local_5a0,&local_de8,(either *)&res,&local_b20,&local_d68);
                std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
                emplace_back<toml::error_info>(this,&local_5a0);
                error_info::~error_info(&local_5a0);
                std::__cxx11::string::~string((string *)&local_d68);
                location::~location(&local_b20);
                std::
                vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                           *)&res.field_1.fail_);
                std::__cxx11::string::~string((string *)&local_de8);
                plVar17 = (location *)ctx;
                skip_until_next_table<toml::type_config>(loc,ctx);
LAB_0031f858:
                std::
                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&inserted);
                goto LAB_0031f865;
              }
            }
          }
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&inserted);
          result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
          ::cleanup(&com_res,(EVP_PKEY_CTX *)prVar18);
          local_e20._M_buckets = &local_e20._M_single_bucket;
          local_e20._M_bucket_count = 1;
          local_e20._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_e20._M_element_count = 0;
          local_e20._M_rehash_policy._M_max_load_factor = 1.0;
          local_e20._M_rehash_policy._4_4_ = 0;
          local_e20._M_rehash_policy._M_next_resize = 0;
          local_e20._M_single_bucket = (__node_base_ptr)0x0;
          local_1038.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               com.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1038.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               com.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1038.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               com.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          com.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          com.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          com.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          region::region(&local_228,&reg);
          fmt._0_8_ = (ulong)((uint)local_1290 & 0xffff0000) | 0x200;
          fmt.name_indent = 0;
          fmt.closing_indent = 0;
          basic_value<toml::type_config>::basic_value
                    ((basic_value<toml::type_config> *)&res,(table_type *)&local_e20,fmt,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_1038,&local_228);
          region::~region(&local_228);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1038);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&local_e20);
          ptVar11 = basic_value<toml::type_config>::as_table_abi_cxx11_(&root);
          region::region(&local_290,&reg);
          basic_value<toml::type_config>::basic_value
                    (&local_f8,(basic_value<toml::type_config> *)&res);
          insert_value<toml::type_config>
                    (&inserted,array_table,ptVar11,&local_1318,&local_290,&local_f8);
          basic_value<toml::type_config>::~basic_value(&local_f8);
          region::~region(&local_290);
          local_1290 = fmt._0_8_;
          if (inserted.is_ok_ == false) {
            peVar13 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap_err
                                (&inserted,(source_location)0x4dada0);
            error_info::error_info(&local_5f8,peVar13);
            std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
            emplace_back<toml::error_info>(this,&local_5f8);
            error_info::~error_info(&local_5f8);
            local_e58._M_buckets = &local_e58._M_single_bucket;
            local_e58._M_bucket_count = 1;
            local_e58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_e58._M_element_count = 0;
            local_e58._M_rehash_policy._M_max_load_factor = 1.0;
            local_e58._M_rehash_policy._4_4_ = 0;
            local_e58._M_rehash_policy._M_next_resize = 0;
            local_e58._M_single_bucket = (__node_base_ptr)0x0;
            basic_value<toml::type_config>::basic_value
                      ((basic_value<toml::type_config> *)&com_res,(table_type *)&local_e58);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_e58);
            parse_table<toml::type_config>
                      (&res_1,loc,ctx,(basic_value<toml::type_config> *)&com_res);
            if (res_1.is_ok_ == false) {
              peVar7 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                                 (&res_1,(source_location)0x4dadb8);
              error_info::error_info(&local_808,peVar7);
              std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
              emplace_back<toml::error_info>(this,&local_808);
              error_info::~error_info(&local_808);
              plVar17 = (location *)ctx;
              skip_until_next_table<toml::type_config>(loc,ctx);
            }
LAB_0031f660:
            result<toml::detail::none_t,_toml::error_info>::cleanup(&res_1,(EVP_PKEY_CTX *)plVar17);
            basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&com_res)
            ;
          }
          else {
            ppbVar12 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                                 (&inserted,(source_location)0x4dadd0);
            pbVar14 = *ppbVar12;
            parse_table<toml::type_config>
                      ((result<toml::detail::none_t,_toml::error_info> *)&com_res,loc,ctx,pbVar14);
            if (com_res.is_ok_ == false) {
              peVar7 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                                 ((result<toml::detail::none_t,_toml::error_info> *)&com_res,
                                  (source_location)0x4dade8);
              error_info::error_info(&local_860,peVar7);
              std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
              emplace_back<toml::error_info>(this,&local_860);
              error_info::~error_info(&local_860);
              plVar17 = (location *)ctx;
              skip_until_next_table<toml::type_config>(loc,ctx);
            }
            uVar3 = sp.
                    super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                    .
                    super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                    ._M_payload._M_value.indent_type;
            if ((sp.
                 super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                 .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
                 _M_engaged == true) &&
               (sp.
                super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                ._M_payload.
                super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
                _M_payload._M_value.indent_type != none)) {
              ptVar5 = basic_value<toml::type_config>::as_table_fmt(pbVar14);
              uVar19 = sp.
                       super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                       .
                       super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                       ._M_payload._M_value.indent;
              ptVar5->indent_type = uVar3;
              if (sp.
                  super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                  .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
                  _M_engaged == false) {
                std::__throw_bad_optional_access();
              }
              ptVar5 = basic_value<toml::type_config>::as_table_fmt(pbVar14);
LAB_0031f53e:
              ptVar5->name_indent = uVar19;
            }
LAB_0031f542:
            result<toml::detail::none_t,_toml::error_info>::cleanup
                      ((result<toml::detail::none_t,_toml::error_info> *)&com_res,
                       (EVP_PKEY_CTX *)plVar17);
          }
          result<toml::basic_value<toml::type_config>_*,_toml::error_info>::cleanup
                    (&inserted,(EVP_PKEY_CTX *)plVar17);
          basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&res);
        }
        else {
          peVar10 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                    ::unwrap_err(&com_res,(source_location)0x4dad88);
          error_info::error_info(&local_7b0,peVar10);
          std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
          emplace_back<toml::error_info>(this,&local_7b0);
          error_info::~error_info(&local_7b0);
          plVar17 = (location *)ctx;
          skip_until_next_table<toml::type_config>(loc,ctx);
LAB_0031f865:
          result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
          ::cleanup(&com_res,(EVP_PKEY_CTX *)plVar17);
        }
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&com);
        region::~region(&reg);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1318);
        result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
        ::cleanup((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                   *)&com_opt,(EVP_PKEY_CTX *)plVar17);
      }
      else {
        result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
        ::cleanup((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                   *)&com_opt,(EVP_PKEY_CTX *)plVar16);
        plVar16 = loc;
        parse_table_key<toml::type_config>
                  ((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                    *)&com_opt,loc,ctx);
        if (com_opt.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._0_1_ == '\x01') {
          pvVar8 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                   ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                             *)&com_opt,(source_location)0x4dae00);
          local_1318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pvVar8->first).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pvVar8->first).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pvVar8->first).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (pvVar8->first).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar8->first).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pvVar8->first).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvVar8 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                   ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                             *)&com_opt,(source_location)0x4dae18);
          region::region(&reg,&pvVar8->second);
          com.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          com.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          com.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          if (sp.
              super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
              _M_payload.
              super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
              .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
              _M_engaged == true) {
            uVar15 = 0;
            while( true ) {
              if ((sp.
                   super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                   .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                   ._M_engaged & 1U) == 0) {
                std::__throw_bad_optional_access();
              }
              if ((ulong)((long)sp.
                                super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                                .
                                super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                                ._M_payload._M_value.comments.comments.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          sp.
                          super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                          .
                          super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                          ._M_payload._8_8_ >> 5) <= uVar15) break;
              pvVar9 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::at(&this_00->comments,uVar15);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&com,
                         pvVar9);
              uVar15 = uVar15 + 1;
            }
          }
          parse_comment_line<toml::type_config>(&com_res,loc,ctx);
          if (com_res.is_ok_ == true) {
            p_Var6 = &result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                      ::unwrap(&com_res,(source_location)0x4dae30)->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ;
            std::
            _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              *)&inserted,p_Var6);
            if (inserted.field_1._24_1_ == '\x01') {
              prVar18 = &inserted;
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&com,(value_type *)prVar18);
            }
            else {
              prVar18 = (result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)ctx;
              skip_whitespace<toml::type_config>(loc,ctx);
              peVar1 = (loc->source_).
                       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              if (loc->location_ <
                  (ulong)((long)(peVar1->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(peVar1->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start)) {
                prVar18 = (result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)&res_1
                ;
                syntax::newline((either *)prVar18,&ctx->toml_spec_);
                either::scan((region *)&res,(either *)prVar18,loc);
                lVar2 = CONCAT71(res._1_7_,res.is_ok_);
                region::~region((region *)&res);
                std::
                vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                           *)&res_1.field_1.fail_);
                if (lVar2 == 0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_e78,"toml::parse_file: newline (or EOF) expected",
                             (allocator<char> *)&res_1);
                  syntax::newline((either *)&res,&ctx->toml_spec_);
                  location::location(&local_b68,loc);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_d88,"",&local_1369);
                  make_syntax_error<toml::detail::either>
                            (&local_650,&local_e78,(either *)&res,&local_b68,&local_d88);
                  std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
                  emplace_back<toml::error_info>(this,&local_650);
                  error_info::~error_info(&local_650);
                  std::__cxx11::string::~string((string *)&local_d88);
                  location::~location(&local_b68);
                  std::
                  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                  ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                             *)&res.field_1.fail_);
                  std::__cxx11::string::~string((string *)&local_e78);
                  plVar17 = (location *)ctx;
                  skip_until_next_table<toml::type_config>(loc,ctx);
                  goto LAB_0031f858;
                }
              }
            }
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&inserted);
            result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
            ::cleanup(&com_res,(EVP_PKEY_CTX *)prVar18);
            local_eb0._M_buckets = &local_eb0._M_single_bucket;
            local_eb0._M_bucket_count = 1;
            local_eb0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_eb0._M_element_count = 0;
            local_eb0._M_rehash_policy._M_max_load_factor = 1.0;
            local_eb0._M_rehash_policy._4_4_ = 0;
            local_eb0._M_rehash_policy._M_next_resize = 0;
            local_eb0._M_single_bucket = (__node_base_ptr)0x0;
            local_1058.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 com.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_1058.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 com.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_1058.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 com.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            com.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            com.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            com.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            region::region(&local_2f8,&reg);
            fmt_00._0_8_ = (ulong)((uint)local_12a0 & 0xffff0000) | 0x200;
            fmt_00.name_indent = 0;
            fmt_00.closing_indent = 0;
            basic_value<toml::type_config>::basic_value
                      ((basic_value<toml::type_config> *)&res,(table_type *)&local_eb0,fmt_00,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_1058,&local_2f8);
            region::~region(&local_2f8);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1058);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_eb0);
            ptVar11 = basic_value<toml::type_config>::as_table_abi_cxx11_(&root);
            region::region(&local_360,&reg);
            basic_value<toml::type_config>::basic_value
                      (&local_1c0,(basic_value<toml::type_config> *)&res);
            insert_value<toml::type_config>
                      (&inserted,std_table,ptVar11,&local_1318,&local_360,&local_1c0);
            basic_value<toml::type_config>::~basic_value(&local_1c0);
            region::~region(&local_360);
            local_12a0 = fmt_00._0_8_;
            if (inserted.is_ok_ == false) {
              peVar13 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap_err
                                  (&inserted,(source_location)0x4dae60);
              error_info::error_info(&local_6a8,peVar13);
              std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
              emplace_back<toml::error_info>(this,&local_6a8);
              error_info::~error_info(&local_6a8);
              local_ee8._M_buckets = &local_ee8._M_single_bucket;
              local_ee8._M_bucket_count = 1;
              local_ee8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_ee8._M_element_count = 0;
              local_ee8._M_rehash_policy._M_max_load_factor = 1.0;
              local_ee8._M_rehash_policy._4_4_ = 0;
              local_ee8._M_rehash_policy._M_next_resize = 0;
              local_ee8._M_single_bucket = (__node_base_ptr)0x0;
              basic_value<toml::type_config>::basic_value
                        ((basic_value<toml::type_config> *)&com_res,(table_type *)&local_ee8);
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable(&local_ee8);
              parse_table<toml::type_config>
                        (&res_1,loc,ctx,(basic_value<toml::type_config> *)&com_res);
              if (res_1.is_ok_ == false) {
                peVar7 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                                   (&res_1,(source_location)0x4dae78);
                error_info::error_info(&local_910,peVar7);
                std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
                emplace_back<toml::error_info>(this,&local_910);
                error_info::~error_info(&local_910);
                plVar17 = (location *)ctx;
                skip_until_next_table<toml::type_config>(loc,ctx);
              }
              goto LAB_0031f660;
            }
            ppbVar12 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                                 (&inserted,(source_location)0x4dae90);
            pbVar14 = *ppbVar12;
            parse_table<toml::type_config>
                      ((result<toml::detail::none_t,_toml::error_info> *)&com_res,loc,ctx,pbVar14);
            if (com_res.is_ok_ == false) {
              peVar7 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                                 ((result<toml::detail::none_t,_toml::error_info> *)&com_res,
                                  (source_location)0x4daea8);
              error_info::error_info(&local_968,peVar7);
              std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
              emplace_back<toml::error_info>(this,&local_968);
              error_info::~error_info(&local_968);
              plVar17 = (location *)ctx;
              skip_until_next_table<toml::type_config>(loc,ctx);
            }
            uVar3 = sp.
                    super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                    .
                    super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                    ._M_payload._M_value.indent_type;
            if ((sp.
                 super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                 .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
                 _M_engaged == true) &&
               (sp.
                super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                ._M_payload.
                super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
                _M_payload._M_value.indent_type != none)) {
              ptVar5 = basic_value<toml::type_config>::as_table_fmt(pbVar14);
              uVar19 = sp.
                       super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                       .
                       super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                       ._M_payload._M_value.indent;
              ptVar5->indent_type = uVar3;
              if (sp.
                  super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                  .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
                  _M_engaged == false) {
                std::__throw_bad_optional_access();
              }
              ptVar5 = basic_value<toml::type_config>::as_table_fmt(pbVar14);
              goto LAB_0031f53e;
            }
            goto LAB_0031f542;
          }
          peVar10 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                    ::unwrap_err(&com_res,(source_location)0x4dae48);
          error_info::error_info(&local_8b8,peVar10);
          std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
          emplace_back<toml::error_info>(this,&local_8b8);
          error_info::~error_info(&local_8b8);
          plVar17 = (location *)ctx;
          skip_until_next_table<toml::type_config>(loc,ctx);
          goto LAB_0031f865;
        }
        result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
        ::cleanup((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                   *)&com_opt,(EVP_PKEY_CTX *)plVar16);
        location::location((location *)&com_res,loc);
        com_opt.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__scanner_base_004daa58;
        com_opt.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = (size_type)anon_var_dwarf_160e43b;
        com_opt.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = 2;
        literal::scan((region *)&res,(literal *)&com_opt,loc);
        lVar2 = CONCAT71(res._1_7_,res.is_ok_);
        region::~region((region *)&res);
        location::operator=(loc,(location *)&com_res);
        if (lVar2 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f28,"toml::parse_file: invalid table key",
                     (allocator<char> *)&com_opt);
          syntax::std_table((sequence *)&res,&ctx->toml_spec_);
          location::location(&local_bf8,loc);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_dc8,"",(allocator<char> *)&reg);
          make_syntax_error<toml::detail::sequence>
                    (&local_758,&local_f28,(sequence *)&res,&local_bf8,&local_dc8);
          std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
          emplace_back<toml::error_info>(this,&local_758);
          error_info::~error_info(&local_758);
          std::__cxx11::string::~string((string *)&local_dc8);
          location::~location(&local_bf8);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)&res.field_1.fail_);
          this_01 = &local_f28;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f08,"toml::parse_file: invalid array-table key",
                     (allocator<char> *)&com_opt);
          syntax::array_table((sequence *)&res,&ctx->toml_spec_);
          location::location(&local_bb0,loc);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_da8,"",(allocator<char> *)&reg);
          make_syntax_error<toml::detail::sequence>
                    (&local_700,&local_f08,(sequence *)&res,&local_bb0,&local_da8);
          std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
          emplace_back<toml::error_info>(this,&local_700);
          error_info::~error_info(&local_700);
          std::__cxx11::string::~string((string *)&local_da8);
          location::~location(&local_bb0);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)&res.field_1.fail_);
          this_01 = &local_f08;
        }
        std::__cxx11::string::~string((string *)this_01);
        skip_until_next_table<toml::type_config>(loc,ctx);
        location::~location((location *)&com_res);
      }
      std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::_M_reset
                ((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *)&sp);
      pbVar14 = extraout_RDX_00;
    }
    if ((ctx->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (ctx->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ok<toml::basic_value<toml::type_config>>
                ((success<toml::basic_value<toml::type_config>_> *)&local_4f0,(toml *)&root,pbVar14)
      ;
      result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
      ::result(__return_storage_ptr__,(success_type *)&local_4f0);
      basic_value<toml::type_config>::~basic_value(&local_4f0);
    }
    else {
      err<std::vector<toml::error_info,std::allocator<toml::error_info>>const>
                ((failure<std::vector<toml::error_info,_std::allocator<toml::error_info>_>_> *)
                 &local_d48,(toml *)this,
                 (vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar14);
      __return_storage_ptr__->is_ok_ = false;
      (__return_storage_ptr__->field_1).fail_.value.
      super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_d48.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl
           .super__Vector_impl_data._M_start;
      (__return_storage_ptr__->field_1).fail_.value.
      super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d48.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl
           .super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->field_1).fail_.value.
      super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_d48.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
      local_d48.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d48.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d48.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<toml::error_info,_std::allocator<toml::error_info>_>::~vector(&local_d48);
    }
    basic_value<toml::type_config>::~basic_value(&root);
  }
  else {
    local_c30._M_buckets = &local_c30._M_single_bucket;
    local_c30._M_bucket_count = 1;
    local_c30._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_c30._M_element_count = 0;
    local_c30._M_rehash_policy._M_max_load_factor = 1.0;
    local_c30._M_rehash_policy._4_4_ = 0;
    local_c30._M_rehash_policy._M_next_resize = 0;
    local_c30._M_single_bucket = (__node_base_ptr)0x0;
    local_1208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    region::region(&local_9d0,loc);
    basic_value<toml::type_config>::basic_value
              (&root,(table_type *)&local_c30,(table_format_info)ZEXT816(0),&local_1208,&local_9d0);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_428,(toml *)&root,v);
    result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
    ::result(__return_storage_ptr__,(success_type *)&local_428);
    basic_value<toml::type_config>::~basic_value(&local_428);
    basic_value<toml::type_config>::~basic_value(&root);
    region::~region(&local_9d0);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1208);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_c30);
  }
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, std::vector<error_info>>
parse_file(location& loc, context<TC>& ctx)
{
    using value_type = basic_value<TC>;
    using table_type = typename value_type::table_type;

    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    if(loc.eof())
    {
        return ok(value_type(table_type(), table_format_info{}, {}, region(loc)));
    }

    value_type root(table_type(), table_format_info{}, {}, region(loc));
    root.as_table_fmt().fmt = table_format::multiline;
    root.as_table_fmt().indent_type = indent_char::none;

    // parse top comment.
    //
    // ```toml
    // # this is a comment for the top-level table.
    //
    // key = "the first value"
    // ```
    //
    // ```toml
    // # this is a comment for "the first value".
    // key = "the first value"
    // ```
    while( ! loc.eof())
    {
        if(auto com_res = parse_comment_line(loc, ctx))
        {
            if(auto com_opt = com_res.unwrap())
            {
                root.comments().push_back(std::move(com_opt.value()));
            }
            else // no comment found.
            {
                // if it is not an empty line, clear the root comment.
                if( ! sequence(syntax::ws(spec), syntax::newline(spec)).scan(loc).is_ok())
                {
                    loc = first;
                    root.comments().clear();
                }
                break;
            }
        }
        else
        {
            ctx.report_error(std::move(com_res.unwrap_err()));
            skip_comment_block(loc, ctx);
        }
    }

    // parse root table
    {
        const auto res = parse_table(loc, ctx, root);
        if(res.is_err())
        {
            ctx.report_error(std::move(res.unwrap_err()));
            skip_until_next_table(loc, ctx);
        }
    }

    // parse tables

    while( ! loc.eof())
    {
        auto sp = skip_multiline_spacer(loc, ctx, /*newline_found=*/true);

        if(auto key_res = parse_array_table_key(loc, ctx))
        {
            auto key = std::move(std::get<0>(key_res.unwrap()));
            auto reg = std::move(std::get<1>(key_res.unwrap()));

            std::vector<std::string> com;
            if(sp.has_value())
            {
                for(std::size_t i=0; i<sp.value().comments.size(); ++i)
                {
                    com.push_back(std::move(sp.value().comments.at(i)));
                }
            }

            // [table.def] must be followed by one of
            // - a comment line
            // - whitespace + newline
            // - EOF
            if(auto com_res = parse_comment_line(loc, ctx))
            {
                if(auto com_opt = com_res.unwrap())
                {
                    com.push_back(com_opt.value());
                }
                else // if there is no comment, ws+newline must exist (or EOF)
                {
                    skip_whitespace(loc, ctx);
                    if( ! loc.eof() && ! syntax::newline(ctx.toml_spec()).scan(loc).is_ok())
                    {
                        ctx.report_error(make_syntax_error("toml::parse_file: "
                            "newline (or EOF) expected",
                            syntax::newline(ctx.toml_spec()), loc));
                        skip_until_next_table(loc, ctx);
                        continue;
                    }
                }
            }
            else // comment syntax error (rare)
            {
                ctx.report_error(com_res.unwrap_err());
                skip_until_next_table(loc, ctx);
                continue;
            }

            table_format_info fmt;
            fmt.fmt = table_format::multiline;
            fmt.indent_type = indent_char::none;
            auto tab = value_type(table_type{}, std::move(fmt), std::move(com), reg);

            auto inserted = insert_value(inserting_value_kind::array_table,
                std::addressof(root.as_table()),
                key, std::move(reg), std::move(tab));

            if(inserted.is_err())
            {
                ctx.report_error(inserted.unwrap_err());

                // check errors in the table
                auto tmp = basic_value<TC>(table_type());
                auto res = parse_table(loc, ctx, tmp);
                if(res.is_err())
                {
                    ctx.report_error(res.unwrap_err());
                    skip_until_next_table(loc, ctx);
                }
                continue;
            }

            auto tab_ptr = inserted.unwrap();
            assert(tab_ptr);

            const auto tab_res = parse_table(loc, ctx, *tab_ptr);
            if(tab_res.is_err())
            {
                ctx.report_error(tab_res.unwrap_err());
                skip_until_next_table(loc, ctx);
            }

            // parse_table first clears `indent_type`.
            // to keep header indent info, we must store it later.
            if(sp.has_value() && sp.value().indent_type != indent_char::none)
            {
                tab_ptr->as_table_fmt().indent_type = sp.value().indent_type;
                tab_ptr->as_table_fmt().name_indent = sp.value().indent;
            }
            continue;
        }
        if(auto key_res = parse_table_key(loc, ctx))
        {
            auto key = std::move(std::get<0>(key_res.unwrap()));
            auto reg = std::move(std::get<1>(key_res.unwrap()));

            std::vector<std::string> com;
            if(sp.has_value())
            {
                for(std::size_t i=0; i<sp.value().comments.size(); ++i)
                {
                    com.push_back(std::move(sp.value().comments.at(i)));
                }
            }

            // [table.def] must be followed by one of
            // - a comment line
            // - whitespace + newline
            // - EOF
            if(auto com_res = parse_comment_line(loc, ctx))
            {
                if(auto com_opt = com_res.unwrap())
                {
                    com.push_back(com_opt.value());
                }
                else // if there is no comment, ws+newline must exist (or EOF)
                {
                    skip_whitespace(loc, ctx);
                    if( ! loc.eof() && ! syntax::newline(ctx.toml_spec()).scan(loc).is_ok())
                    {
                        ctx.report_error(make_syntax_error("toml::parse_file: "
                            "newline (or EOF) expected",
                            syntax::newline(ctx.toml_spec()), loc));
                        skip_until_next_table(loc, ctx);
                        continue;
                    }
                }
            }
            else // comment syntax error (rare)
            {
                ctx.report_error(com_res.unwrap_err());
                skip_until_next_table(loc, ctx);
                continue;
            }

            table_format_info fmt;
            fmt.fmt = table_format::multiline;
            fmt.indent_type = indent_char::none;
            auto tab = value_type(table_type{}, std::move(fmt), std::move(com), reg);

            auto inserted = insert_value(inserting_value_kind::std_table,
                std::addressof(root.as_table()),
                key, std::move(reg), std::move(tab));

            if(inserted.is_err())
            {
                ctx.report_error(inserted.unwrap_err());

                // check errors in the table
                auto tmp = basic_value<TC>(table_type());
                auto res = parse_table(loc, ctx, tmp);
                if(res.is_err())
                {
                    ctx.report_error(res.unwrap_err());
                    skip_until_next_table(loc, ctx);
                }
                continue;
            }

            auto tab_ptr = inserted.unwrap();
            assert(tab_ptr);

            const auto tab_res = parse_table(loc, ctx, *tab_ptr);
            if(tab_res.is_err())
            {
                ctx.report_error(tab_res.unwrap_err());
                skip_until_next_table(loc, ctx);
            }
            if(sp.has_value() && sp.value().indent_type != indent_char::none)
            {
                tab_ptr->as_table_fmt().indent_type = sp.value().indent_type;
                tab_ptr->as_table_fmt().name_indent = sp.value().indent;
            }
            continue;
        }

        // does not match array_table nor std_table. report an error.
        const auto keytop = loc;
        const auto maybe_array_of_tables = literal("[[").scan(loc).is_ok();
        loc = keytop;

        if(maybe_array_of_tables)
        {
            ctx.report_error(make_syntax_error("toml::parse_file: invalid array-table key",
                syntax::array_table(spec), loc));
        }
        else
        {
            ctx.report_error(make_syntax_error("toml::parse_file: invalid table key",
                syntax::std_table(spec), loc));
        }
        skip_until_next_table(loc, ctx);
    }

    if( ! ctx.errors().empty())
    {
        return err(std::move(ctx.errors()));
    }
    return ok(std::move(root));
}